

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_channel_id_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = SSL_is_dtls(hs->ssl);
    if (iVar2 != 0) {
      __assert_fail("!SSL_is_dtls(hs->ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x63d,
                    "bool bssl::ext_channel_id_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)"
                   );
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->config->channel_id_private);
    if (!bVar1) {
      __assert_fail("hs->config->channel_id_private",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x63e,
                    "bool bssl::ext_channel_id_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)"
                   );
    }
    sVar3 = CBS_len(contents);
    if (sVar3 == 0) {
      *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfeffffff | 0x1000000;
      hs_local._7_1_ = true;
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_channel_id_parse_serverhello(SSL_HANDSHAKE *hs,
                                             uint8_t *out_alert,
                                             CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  assert(!SSL_is_dtls(hs->ssl));
  assert(hs->config->channel_id_private);

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->channel_id_negotiated = true;
  return true;
}